

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAttribute.cpp
# Opt level: O0

void __thiscall
iDynTree::XMLAttribute::XMLAttribute
          (XMLAttribute *this,string *name,string *value,string *prefix,string *uri)

{
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string *in_R8;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RDX);
  std::__cxx11::string::string(in_RDI + 0x40,in_RCX);
  std::__cxx11::string::string(in_RDI + 0x60,in_R8);
  return;
}

Assistant:

XMLAttribute::XMLAttribute(std::string name, std::string value, std::string prefix, std::string uri)
    : m_name(name)
    , m_value(value)
    , m_prefix(prefix)
    , m_uri(uri) {}